

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

int __thiscall
phmap::priv::
base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
::erase(base_checker<phmap::btree_multiset<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>,_std::multiset<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>_>
        *this,key_type *key)

{
  size_type sVar1;
  size_t sVar2;
  pointer *__ptr;
  char *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_std::_Rb_tree_iterator<std::pair<int,_int>_>_>
  pVar4;
  AssertionResult gtest_ar;
  int res;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  int local_34;
  
  sVar1 = (this->tree_).
          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
          .tree_.size_;
  pVar4 = std::
          _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::equal_range(&(this->checker_)._M_t,key);
  sVar2 = (this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::_M_erase_aux(&(this->checker_)._M_t,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  local_34 = (int)sVar2 - (int)(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
       ::count_multi<std::pair<int,int>>
                 ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                   *)this,key);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_48,"res","tree_.count(key)",&local_34,(unsigned_long *)&local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0xd7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
       ::erase_multi<std::pair<int,int>>
                 ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                   *)this,key);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_48,"res","tree_.erase(key)",&local_34,(unsigned_long *)&local_58);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
       ::count_multi<std::pair<int,int>>
                 ((btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,true>>
                   *)this,key);
  local_50.data_ = (AssertHelperData *)((ulong)local_50.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_48,"tree_.count(key)","0",(unsigned_long *)&local_58,(int *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->tree_).
       super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
       .
       super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_true>_>_>
       .tree_.size_;
  local_50.data_ = (AssertHelperData *)(sVar1 - (long)local_34);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_48,"tree_.size()","size - res",(unsigned_long *)&local_58,
             (unsigned_long *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  erase_check(this,key);
  return local_34;
}

Assistant:

int erase(const key_type &key) {
        size_t size = tree_.size();
        int res = (int)checker_.erase(key);
        EXPECT_EQ(res, tree_.count(key));
        EXPECT_EQ(res, tree_.erase(key));
        EXPECT_EQ(tree_.count(key), 0);
        EXPECT_EQ(tree_.size(), size - res);
        erase_check(key);
        return res;
    }